

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linked_definitions_section.cpp
# Opt level: O1

void __thiscall
LinkedDefinitionsSection_RoundTripForPopulated_Test::
LinkedDefinitionsSection_RoundTripForPopulated_Test
          (LinkedDefinitionsSection_RoundTripForPopulated_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_LinkedDefinitionsSection).super_Test._vptr_Test =
       (_func_int **)&PTR__LinkedDefinitionsSection_00240670;
  in_memory_store::in_memory_store(&(this->super_LinkedDefinitionsSection).export_store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->super_LinkedDefinitionsSection).export_db_,
             &(this->super_LinkedDefinitionsSection).export_store_.file_,true);
  in_memory_store::in_memory_store(&(this->super_LinkedDefinitionsSection).import_store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->super_LinkedDefinitionsSection).import_db_,
             &(this->super_LinkedDefinitionsSection).import_store_.file_,true);
  (this->super_LinkedDefinitionsSection).export_db_.vacuum_mode_ = disabled;
  (this->super_LinkedDefinitionsSection).import_db_.vacuum_mode_ = disabled;
  (this->super_LinkedDefinitionsSection).super_Test._vptr_Test =
       (_func_int **)&PTR__LinkedDefinitionsSection_00240600;
  return;
}

Assistant:

TEST_F (LinkedDefinitionsSection, RoundTripForPopulated) {
    using testing::ContainerEq;
    constexpr auto referenced_compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    constexpr auto max_addr =
        typed_address<repo::definition>::make (std::numeric_limits<std::uint64_t>::max ());
    std::vector<repo::linked_definitions::value_type> exported_content{
        {referenced_compilation_digest, UINT32_C (0), max_addr},
        {referenced_compilation_digest, UINT32_C (1), max_addr},
    };

    // Build and export a fragment which contains a linked-definitions section with the contents
    // supplied from the export_content vector. The resulting JSON is in exported_json.
    std::string exported_json = this->export_fragment (
        exported_content.data (), exported_content.data () + exported_content.size ());

    // Now build the import database. First we we create a compilation that the linked-definition
    // fragment will later reference.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            constexpr index::digest fragment_digest{0x9ABCDEF0, 0x12345678};
            pstore::extent<repo::fragment> const fext;
            constexpr auto str = pstore::typed_address<pstore::indirect_string>::make (0U);
            std::vector<repo::definition> definitions{
                {fragment_digest, fext, str, pstore::repo::linkage::external},
                {fragment_digest, fext, str, pstore::repo::linkage::external},
            };
            auto compilation_index =
                pstore::index::get_index<pstore::trailer::indices::compilation> (transaction.db ());
            compilation_index->insert (
                transaction, std::make_pair (referenced_compilation_digest,
                                             repo::compilation::alloc (transaction, str /*triple*/,
                                                                       std::begin (definitions),
                                                                       std::end (definitions))));
        }
        transaction.commit ();
    }

    constexpr auto imported_digest = pstore::index::digest{0x31415192, 0x9ABCDEF0};
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            exchange::import_ns::string_mapping imported_names;
            auto parser = make_json_object_parser<exchange::import_ns::fragment_sections> (
                &import_db_, &transaction, &imported_names, &imported_digest);
            parser.input (exported_json).eof ();
            ASSERT_FALSE (parser.has_error ())
                << "JSON error was: " << parser.last_error ().message () << ' '
                << parser.coordinate () << '\n'
                << exported_json;

            std::shared_ptr<exchange::import_ns::context> const & ctxt =
                parser.callbacks ().get_context ();
            ctxt->apply_patches (&transaction);
        }
        transaction.commit ();
    }

    auto fragments_index = index::get_index<trailer::indices::fragment> (import_db_);
    auto pos = fragments_index->find (import_db_, imported_digest);
    ASSERT_NE (pos, fragments_index->end (import_db_));
    auto imported_fragment = repo::fragment::load (import_db_, pos->second);
    ASSERT_TRUE (imported_fragment->has_section (repo::section_kind::linked_definitions));
    repo::linked_definitions const & linked =
        imported_fragment->at<repo::section_kind::linked_definitions> ();
    ASSERT_EQ (linked.size (), 2U);
    auto expos = exported_content.begin ();
    auto impos = linked.begin ();
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
    ++expos;
    ++impos;
    EXPECT_EQ (expos->compilation, impos->compilation);
    EXPECT_EQ (expos->index, impos->index);
    check_linked_definition (import_db_, *impos);
}